

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O1

int inflateBack(z_streamp strm,in_func in,void *in_desc,out_func out,void *out_desc)

{
  byte bVar1;
  internal_state *piVar2;
  z_streamp pzVar3;
  uchar *puVar4;
  void *pvVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  byte *pbVar11;
  ulg uVar12;
  Posf *pPVar13;
  char *pcVar14;
  byte bVar15;
  undefined2 uVar16;
  ushort *puVar17;
  uint uVar18;
  ulong uVar19;
  long *plVar20;
  ulong uVar21;
  ushort uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  bool bVar27;
  uchar *next;
  byte *local_a0;
  z_streamp local_98;
  uint local_90;
  uint local_8c;
  in_func local_88;
  void *local_80;
  uchar *local_78;
  long *local_70;
  void *local_68;
  out_func local_60;
  uInt *local_58;
  ct_data_s *local_50;
  Posf **local_48;
  ct_data_s *local_40;
  uint *local_38;
  
  if ((strm == (z_streamp)0x0) || (piVar2 = strm->state, piVar2 == (internal_state *)0x0)) {
    return -2;
  }
  strm->msg = (char *)0x0;
  *(undefined8 *)&piVar2->status = 0x3f3f;
  *(undefined4 *)&piVar2->gzindex = 0;
  local_a0 = strm->next_in;
  uVar7 = 0;
  if (local_a0 != (byte *)0x0) {
    uVar7 = strm->avail_in;
  }
  local_78 = *(uchar **)&piVar2->method;
  local_40 = piVar2->dyn_ltree + 0x121;
  local_58 = &piVar2->hash_shift;
  local_48 = &piVar2->head;
  local_70 = &piVar2->block_start;
  local_50 = piVar2->dyn_ltree + 0x91;
  local_38 = (uint *)((long)&piVar2->head + 4);
  uVar21 = 0;
  uVar25 = 0;
  local_98 = strm;
  uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
  local_88 = in;
  local_80 = in_desc;
  local_68 = out_desc;
  local_60 = out;
LAB_00109bb7:
  local_90 = uVar24;
  uVar24 = (uint)uVar25;
  iVar9 = piVar2->status;
  bVar15 = (byte)uVar25;
  switch(iVar9) {
  case 0x3f3f:
    if (*(int *)&piVar2->field_0xc == 0) {
      if (uVar24 < 3) {
        if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0)) {
LAB_0010a98b:
          local_a0 = (byte *)0x0;
          iVar8 = -5;
          uVar7 = 0;
          goto LAB_0010a99b;
        }
        uVar24 = uVar24 | 8;
        uVar7 = uVar7 - 1;
        uVar21 = uVar21 + ((ulong)*local_a0 << (bVar15 & 0x3f));
        local_a0 = local_a0 + 1;
      }
      *(uint *)&piVar2->field_0xc = (uint)uVar21 & 1;
      switch((uint)(uVar21 >> 1) & 3) {
      case 0:
        iVar9 = 0x3f41;
        break;
      case 1:
        piVar2->window_size = (ulg)fixedtables_lenfix;
        piVar2->head = (Posf *)0x500000009;
        piVar2->prev = (Posf *)fixedtables_distfix;
        iVar9 = 0x3f48;
        break;
      case 2:
        iVar9 = 0x3f44;
        break;
      case 3:
        local_98->msg = "invalid block type";
        iVar9 = 0x3f51;
      }
      piVar2->status = iVar9;
      uVar21 = uVar21 >> 3;
      uVar25 = (ulong)(uVar24 - 3);
      uVar24 = local_90;
    }
    else {
      uVar21 = uVar21 >> (bVar15 & 7);
      uVar25 = (ulong)(uVar24 & 0xfffffff8);
      piVar2->status = 0x3f50;
      uVar24 = local_90;
    }
    goto LAB_00109bb7;
  case 0x3f41:
    uVar21 = uVar21 >> (bVar15 & 7);
    if (uVar24 < 0x20) {
      uVar19 = (ulong)(uVar24 & 0x18);
      do {
        if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
        goto LAB_0010a98b;
        uVar7 = uVar7 - 1;
        pbVar11 = local_a0 + 1;
        uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar19 & 0x3f));
        uVar25 = uVar19 + 8;
        bVar27 = uVar19 < 0x18;
        uVar19 = uVar25;
        local_a0 = pbVar11;
      } while (bVar27);
      uVar25 = uVar25 & 0xffffffff;
    }
    else {
      uVar25 = (ulong)(uVar24 & 0xfffffff8);
    }
    pvVar5 = local_68;
    if ((uVar21 >> 0x10 ^ uVar21 & 0xffff) != 0xffff) {
      pcVar14 = "invalid stored block lengths";
      goto LAB_0010a67d;
    }
    uVar18 = (uint)uVar21 & 0xffff;
    *(uint *)&piVar2->field_0x5c = uVar18;
    uVar24 = local_90;
    if ((uVar21 & 0xffff) != 0) {
      do {
        if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
        goto LAB_0010a98b;
        if (uVar24 == 0) {
          local_78 = *(uchar **)&piVar2->method;
          uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
          *(uint *)&piVar2->gzindex = uVar24;
          iVar9 = (*local_60)(pvVar5,local_78,uVar24);
          if (iVar9 != 0) goto LAB_0010a9d6;
        }
        puVar4 = local_78;
        if (uVar7 <= uVar18) {
          uVar18 = uVar7;
        }
        if (uVar24 <= uVar18) {
          uVar18 = uVar24;
        }
        uVar25 = (ulong)uVar18;
        memcpy(local_78,local_a0,uVar25);
        local_a0 = local_a0 + uVar25;
        uVar7 = uVar7 - uVar18;
        uVar24 = uVar24 - uVar18;
        local_78 = puVar4 + uVar25;
        uVar18 = *(int *)&piVar2->field_0x5c - uVar18;
        *(uint *)&piVar2->field_0x5c = uVar18;
      } while (uVar18 != 0);
    }
    piVar2->status = 0x3f3f;
    uVar21 = 0;
    uVar25 = 0;
    goto LAB_00109bb7;
  case 0x3f44:
    break;
  case 0x3f48:
    goto switchD_00109bd8_caseD_3f48;
  default:
    if (iVar9 == 0x3f50) {
      uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
      iVar8 = 1;
      uVar18 = uVar24 - local_90;
      if (local_90 <= uVar24 && uVar18 != 0) {
        iVar9 = (*local_60)(local_68,*(uchar **)&piVar2->method,uVar18);
        iVar8 = -5;
        if (iVar9 == 0) {
          iVar8 = 1;
        }
      }
      goto LAB_0010a99b;
    }
    iVar8 = -3;
    if (iVar9 == 0x3f51) goto LAB_0010a99b;
  case 0x3f40:
  case 0x3f42:
  case 0x3f43:
  case 0x3f45:
  case 0x3f46:
  case 0x3f47:
    iVar8 = -2;
LAB_0010a99b:
    local_98->next_in = local_a0;
    local_98->avail_in = uVar7;
    return iVar8;
  }
  uVar19 = uVar25;
  if (uVar24 < 0xe) {
    do {
      if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0)) goto LAB_0010a98b;
      uVar7 = uVar7 - 1;
      pbVar11 = local_a0 + 1;
      uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar19 & 0x3f));
      uVar25 = uVar19 + 8;
      bVar27 = uVar19 < 6;
      uVar19 = uVar25;
      local_a0 = pbVar11;
    } while (bVar27);
  }
  uVar24 = (uint)uVar21 & 0x1f;
  piVar2->hash_size = uVar24 + 0x101;
  uVar18 = (uint)(uVar21 >> 5) & 0x1f;
  piVar2->hash_bits = uVar18 + 1;
  piVar2->ins_h = ((uint)(uVar21 >> 10) & 0xf) + 4;
  uVar21 = uVar21 >> 0xe;
  uVar25 = (ulong)((int)uVar25 - 0xe);
  if (0x1d < uVar24 || 0x1d < uVar18) {
    pcVar14 = "too many length or distance symbols";
    goto LAB_0010a67d;
  }
  piVar2->hash_mask = 0;
  if (piVar2->ins_h != 0) {
    do {
      uVar24 = (uint)uVar25;
      if (uVar24 < 3) {
        if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
        goto LAB_0010a98b;
        uVar24 = uVar24 | 8;
        uVar7 = uVar7 - 1;
        uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
        local_a0 = local_a0 + 1;
      }
      uVar18 = piVar2->hash_mask;
      piVar2->hash_mask = uVar18 + 1;
      *(ushort *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)inflateBack::order[uVar18] * 2) =
           (ushort)uVar21 & 7;
      uVar21 = uVar21 >> 3;
      uVar25 = (ulong)(uVar24 - 3);
    } while (piVar2->hash_mask < piVar2->ins_h);
  }
  uVar19 = (ulong)piVar2->hash_mask;
  if (uVar19 < 0x13) {
    puVar17 = inflateBack::order + uVar19;
    do {
      uVar19 = uVar19 + 1;
      *(undefined2 *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)*puVar17 * 2) = 0;
      puVar17 = puVar17 + 1;
    } while ((int)uVar19 != 0x13);
    piVar2->hash_mask = 0x13;
  }
  *(ct_data_s **)&piVar2->hash_shift = local_40;
  piVar2->window_size = (ulg)local_40;
  *(undefined4 *)&piVar2->head = 7;
  iVar9 = inflate_table(CODES,(unsigned_short *)local_70,0x13,(code **)local_58,(uint *)local_48,
                        (unsigned_short *)local_50);
  if (iVar9 != 0) {
    pcVar14 = "invalid code lengths set";
    goto LAB_0010a67d;
  }
  piVar2->hash_mask = 0;
  if (piVar2->hash_bits + piVar2->hash_size != 0) {
    do {
      uVar19 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
      bVar15 = *(byte *)(piVar2->window_size + 1 + uVar19 * 4);
      if ((uint)uVar25 < (uint)bVar15) {
        do {
          if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
          goto LAB_0010a98b;
          uVar7 = uVar7 - 1;
          pbVar11 = local_a0 + 1;
          uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
          uVar25 = uVar25 + 8;
          uVar19 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
          bVar15 = *(byte *)(piVar2->window_size + 1 + uVar19 * 4);
          local_a0 = pbVar11;
        } while (uVar25 < bVar15);
        lVar10 = piVar2->window_size + uVar19 * 4;
      }
      else {
        lVar10 = piVar2->window_size + uVar19 * 4;
      }
      uVar18 = (uint)bVar15;
      uVar22 = *(ushort *)(lVar10 + 2);
      uVar24 = (uint)uVar25;
      if (0xf < uVar22) {
        if (uVar22 == 0x10) {
          plVar20 = local_70;
          if (uVar24 < uVar18 + 2) {
            local_8c = CONCAT31(local_8c._1_3_,bVar15);
            uVar25 = uVar25 & 0xffffffff;
            do {
              if ((uVar7 == 0) &&
                 (uVar7 = (*local_88)(local_80,&local_a0), plVar20 = local_70, uVar7 == 0))
              goto LAB_0010a98b;
              pbVar11 = local_a0 + 1;
              uVar7 = uVar7 - 1;
              uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
              uVar25 = uVar25 + 8;
              local_a0 = pbVar11;
            } while (uVar25 < uVar18 + 2);
            bVar15 = (byte)local_8c;
          }
          uVar21 = uVar21 >> (bVar15 & 0x3f);
          uVar18 = (int)uVar25 - uVar18;
          uVar25 = (ulong)uVar18;
          if (piVar2->hash_mask != 0) {
            uVar16 = *(undefined2 *)((long)plVar20 + (ulong)(piVar2->hash_mask - 1) * 2);
            iVar9 = ((uint)uVar21 & 3) + 3;
            uVar21 = uVar21 >> 2;
            uVar18 = uVar18 - 2;
            goto LAB_0010a285;
          }
        }
        else {
          if (uVar22 == 0x11) {
            if (uVar24 < uVar18 + 3) {
              local_8c = CONCAT31(local_8c._1_3_,bVar15);
              uVar25 = uVar25 & 0xffffffff;
              do {
                if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
                goto LAB_0010a98b;
                pbVar11 = local_a0 + 1;
                uVar7 = uVar7 - 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                local_a0 = pbVar11;
              } while (uVar25 < uVar18 + 3);
              bVar15 = (byte)local_8c;
            }
            uVar21 = uVar21 >> (bVar15 & 0x3f);
            iVar9 = ((uint)uVar21 & 7) + 3;
            uVar21 = uVar21 >> 3;
            uVar18 = ((int)uVar25 - uVar18) - 3;
          }
          else {
            if (uVar24 < uVar18 + 7) {
              local_8c = CONCAT31(local_8c._1_3_,bVar15);
              uVar25 = uVar25 & 0xffffffff;
              do {
                if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
                goto LAB_0010a98b;
                pbVar11 = local_a0 + 1;
                uVar7 = uVar7 - 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                local_a0 = pbVar11;
              } while (uVar25 < uVar18 + 7);
              bVar15 = (byte)local_8c;
            }
            uVar21 = uVar21 >> (bVar15 & 0x3f);
            iVar9 = ((uint)uVar21 & 0x7f) + 0xb;
            uVar21 = uVar21 >> 7;
            uVar18 = ((int)uVar25 - uVar18) - 7;
          }
          uVar16 = 0;
LAB_0010a285:
          uVar25 = (ulong)uVar18;
          if (piVar2->hash_mask + iVar9 <= piVar2->hash_bits + piVar2->hash_size) {
            uVar24 = piVar2->hash_mask;
            do {
              uVar19 = (ulong)uVar24;
              uVar24 = uVar24 + 1;
              *(undefined2 *)((long)local_70 + uVar19 * 2) = uVar16;
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            piVar2->hash_mask = uVar24;
            goto LAB_0010a2ca;
          }
        }
        local_98->msg = "invalid bit length repeat";
        piVar2->status = 0x3f51;
        break;
      }
      uVar21 = uVar21 >> (bVar15 & 0x3f);
      uVar25 = (ulong)(uVar24 - uVar18);
      uVar24 = piVar2->hash_mask;
      piVar2->hash_mask = uVar24 + 1;
      *(ushort *)((long)(piVar2->dyn_ltree + -0xf) + (ulong)uVar24 * 2) = uVar22;
LAB_0010a2ca:
    } while (piVar2->hash_mask < piVar2->hash_bits + piVar2->hash_size);
  }
  uVar24 = local_90;
  if (piVar2->status != 0x3f51) {
    if (piVar2->dyn_ltree[0x71].fc.freq == 0) {
      pcVar14 = "invalid code -- missing end-of-block";
    }
    else {
      *(ct_data_s **)&piVar2->hash_shift = local_40;
      piVar2->window_size = (ulg)local_40;
      *(undefined4 *)&piVar2->head = 9;
      iVar9 = inflate_table(LENS,(unsigned_short *)local_70,piVar2->hash_size,(code **)local_58,
                            (uint *)local_48,(unsigned_short *)local_50);
      if (iVar9 == 0) {
        piVar2->prev = *(Posf **)&piVar2->hash_shift;
        *(undefined4 *)((long)&piVar2->head + 4) = 6;
        iVar9 = inflate_table(DISTS,(unsigned_short *)
                                    ((long)local_70 + (ulong)piVar2->hash_size * 2),
                              piVar2->hash_bits,(code **)local_58,local_38,
                              (unsigned_short *)local_50);
        if (iVar9 == 0) {
          piVar2->status = 0x3f48;
switchD_00109bd8_caseD_3f48:
          pzVar3 = local_98;
          if ((5 < uVar7) && (0x101 < local_90)) {
            local_98->next_out = local_78;
            local_98->avail_out = local_90;
            local_98->next_in = local_a0;
            local_98->avail_in = uVar7;
            piVar2->w_size = (int)uVar21;
            piVar2->w_bits = (int)(uVar21 >> 0x20);
            piVar2->w_mask = (uint)uVar25;
            uVar7 = *(uint *)((long)&piVar2->gzhead + 4);
            if ((uint)piVar2->gzindex < uVar7) {
              *(uint *)&piVar2->gzindex = uVar7 - local_90;
            }
            inflate_fast(local_98,uVar7);
            local_a0 = pzVar3->next_in;
            local_78 = pzVar3->next_out;
            uVar7 = pzVar3->avail_in;
            uVar21._0_4_ = piVar2->w_size;
            uVar21._4_4_ = piVar2->w_bits;
            uVar25 = (ulong)piVar2->w_mask;
            uVar24 = pzVar3->avail_out;
            goto LAB_00109bb7;
          }
          uVar19 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
          bVar15 = *(byte *)(piVar2->window_size + 1 + uVar19 * 4);
          if ((uint)uVar25 < (uint)bVar15) {
            do {
              if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
              goto LAB_0010a98b;
              uVar7 = uVar7 - 1;
              pbVar11 = local_a0 + 1;
              uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
              uVar25 = uVar25 + 8;
              uVar19 = (ulong)(~(-1 << (*(byte *)&piVar2->head & 0x1f)) & (uint)uVar21);
              bVar15 = *(byte *)(piVar2->window_size + 1 + uVar19 * 4);
              local_a0 = pbVar11;
            } while (uVar25 < bVar15);
            pbVar11 = (byte *)(piVar2->window_size + uVar19 * 4);
          }
          else {
            pbVar11 = (byte *)(piVar2->window_size + uVar19 * 4);
          }
          uVar18 = (uint)bVar15;
          uVar24 = (uint)uVar25;
          uVar22 = *(ushort *)(pbVar11 + 2);
          bVar6 = *pbVar11;
          if ((byte)(bVar6 - 1) < 0xf) {
            uVar23 = (uint)uVar22;
            uVar26 = ~(-1 << (bVar6 + bVar15 & 0x1f));
            uVar12 = piVar2->window_size;
            uVar19 = (ulong)((((uint)uVar21 & uVar26) >> (bVar15 & 0x1f)) + (uint)uVar22);
            bVar1 = *(byte *)(uVar12 + 1 + uVar19 * 4);
            if (uVar24 < uVar18 + bVar1) {
              uVar25 = uVar25 & 0xffffffff;
              local_8c = (uint)uVar22;
              do {
                if ((uVar7 == 0) &&
                   (uVar7 = (*local_88)(local_80,&local_a0), uVar23 = local_8c, uVar7 == 0))
                goto LAB_0010a98b;
                uVar7 = uVar7 - 1;
                pbVar11 = local_a0 + 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                uVar12 = piVar2->window_size;
                uVar19 = (ulong)((((uint)uVar21 & uVar26) >> (bVar15 & 0x1f)) + uVar23);
                bVar1 = *(byte *)(uVar12 + 1 + uVar19 * 4);
                local_a0 = pbVar11;
              } while (uVar25 < uVar18 + bVar1);
            }
            pbVar11 = (byte *)(uVar12 + uVar19 * 4);
            uVar21 = uVar21 >> (bVar15 & 0x3f);
            uVar22 = *(ushort *)(pbVar11 + 2);
            bVar6 = *pbVar11;
            uVar24 = (int)uVar25 - uVar18;
            uVar18 = (uint)bVar1;
          }
          uVar21 = uVar21 >> ((byte)uVar18 & 0x3f);
          uVar25 = (ulong)(uVar24 - uVar18);
          *(uint *)&piVar2->field_0x5c = (uint)uVar22;
          if (bVar6 == 0) {
            uVar24 = local_90;
            if (local_90 == 0) {
              local_78 = *(uchar **)&piVar2->method;
              uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
              *(uint *)&piVar2->gzindex = uVar24;
              iVar9 = (*local_60)(local_68,local_78,uVar24);
              if (iVar9 != 0) {
LAB_0010a9d6:
                iVar8 = -5;
                goto LAB_0010a99b;
              }
            }
            *local_78 = piVar2->field_0x5c;
            local_78 = local_78 + 1;
            piVar2->status = 0x3f48;
            uVar24 = uVar24 - 1;
            goto LAB_00109bb7;
          }
          if ((bVar6 & 0x20) != 0) {
            piVar2->status = 0x3f3f;
            uVar24 = local_90;
            goto LAB_00109bb7;
          }
          if ((bVar6 & 0x40) == 0) {
            *(uint *)((long)&piVar2->window + 4) = bVar6 & 0xf;
            if ((bVar6 & 0xf) != 0) {
              while( true ) {
                uVar24 = *(uint *)((long)&piVar2->window + 4);
                uVar18 = (uint)uVar25;
                if (uVar24 <= uVar18) break;
                if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
                goto LAB_0010a98b;
                uVar7 = uVar7 - 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = (ulong)(uVar18 + 8);
                local_a0 = local_a0 + 1;
              }
              *(uint *)&piVar2->field_0x5c =
                   *(int *)&piVar2->field_0x5c + (~(-1 << ((byte)uVar24 & 0x1f)) & (uint)uVar21);
              uVar21 = uVar21 >> ((byte)uVar24 & 0x3f);
              uVar25 = (ulong)(uVar18 - uVar24);
            }
            uVar19 = (ulong)(~(-1 << (*(byte *)((long)&piVar2->head + 4) & 0x1f)) & (uint)uVar21);
            bVar15 = *(byte *)((long)piVar2->prev + uVar19 * 4 + 1);
            if ((uint)uVar25 < (uint)bVar15) {
              do {
                if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
                goto LAB_0010a98b;
                uVar7 = uVar7 - 1;
                pbVar11 = local_a0 + 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = uVar25 + 8;
                uVar19 = (ulong)(~(-1 << (*(byte *)((long)&piVar2->head + 4) & 0x1f)) & (uint)uVar21
                                );
                bVar15 = *(byte *)((long)piVar2->prev + uVar19 * 4 + 1);
                local_a0 = pbVar11;
              } while (uVar25 < bVar15);
              pPVar13 = piVar2->prev + uVar19 * 2;
            }
            else {
              pPVar13 = piVar2->prev + uVar19 * 2;
            }
            uVar18 = (uint)bVar15;
            uVar24 = (uint)uVar25;
            uVar22 = pPVar13[1];
            bVar6 = (byte)*pPVar13;
            if (bVar6 < 0x10) {
              uVar23 = (uint)uVar22;
              uVar26 = ~(-1 << (bVar6 + bVar15 & 0x1f));
              pPVar13 = piVar2->prev;
              uVar19 = (ulong)((((uint)uVar21 & uVar26) >> (bVar15 & 0x1f)) + (uint)uVar22);
              bVar1 = *(byte *)((long)pPVar13 + uVar19 * 4 + 1);
              if (uVar24 < uVar18 + bVar1) {
                uVar25 = uVar25 & 0xffffffff;
                local_8c = (uint)uVar22;
                do {
                  if ((uVar7 == 0) &&
                     (uVar7 = (*local_88)(local_80,&local_a0), uVar23 = local_8c, uVar7 == 0))
                  goto LAB_0010a98b;
                  uVar7 = uVar7 - 1;
                  pbVar11 = local_a0 + 1;
                  uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                  uVar25 = uVar25 + 8;
                  pPVar13 = piVar2->prev;
                  uVar19 = (ulong)((((uint)uVar21 & uVar26) >> (bVar15 & 0x1f)) + uVar23);
                  bVar1 = *(byte *)((long)pPVar13 + uVar19 * 4 + 1);
                  local_a0 = pbVar11;
                } while (uVar25 < uVar18 + bVar1);
              }
              uVar21 = uVar21 >> (bVar15 & 0x3f);
              uVar22 = (pPVar13 + uVar19 * 2)[1];
              bVar6 = (byte)pPVar13[uVar19 * 2];
              uVar24 = (int)uVar25 - uVar18;
              uVar18 = (uint)bVar1;
            }
            uVar21 = uVar21 >> ((byte)uVar18 & 0x3f);
            uVar25 = (ulong)(uVar24 - uVar18);
            if ((bVar6 & 0x40) != 0) {
              local_98->msg = "invalid distance code";
              piVar2->status = 0x3f51;
              uVar24 = local_90;
              goto LAB_00109bb7;
            }
            *(uint *)&piVar2->window = (uint)uVar22;
            *(uint *)((long)&piVar2->window + 4) = bVar6 & 0xf;
            if ((bVar6 & 0xf) != 0) {
              while( true ) {
                uVar24 = *(uint *)((long)&piVar2->window + 4);
                uVar18 = (uint)uVar25;
                if (uVar24 <= uVar18) break;
                if ((uVar7 == 0) && (uVar7 = (*local_88)(local_80,&local_a0), uVar7 == 0))
                goto LAB_0010a98b;
                uVar7 = uVar7 - 1;
                uVar21 = uVar21 + ((ulong)*local_a0 << ((byte)uVar25 & 0x3f));
                uVar25 = (ulong)(uVar18 + 8);
                local_a0 = local_a0 + 1;
              }
              *(uint *)&piVar2->window =
                   *(int *)&piVar2->window + (~(-1 << ((byte)uVar24 & 0x1f)) & (uint)uVar21);
              uVar21 = uVar21 >> ((byte)uVar24 & 0x3f);
              uVar25 = (ulong)(uVar18 - uVar24);
            }
            uVar18 = *(uint *)((long)&piVar2->gzhead + 4);
            uVar23 = 0;
            if ((uint)piVar2->gzindex < uVar18) {
              uVar23 = local_90;
            }
            uVar24 = local_90;
            if (*(uint *)&piVar2->window <= uVar18 - uVar23) {
              do {
                if (uVar24 == 0) {
                  local_78 = *(uchar **)&piVar2->method;
                  uVar24 = *(uint *)((long)&piVar2->gzhead + 4);
                  *(uint *)&piVar2->gzindex = uVar24;
                  iVar9 = (*local_60)(local_68,local_78,uVar24);
                  if (iVar9 != 0) goto LAB_0010a9d6;
                }
                uVar18 = *(int *)((long)&piVar2->gzhead + 4) - *(uint *)&piVar2->window;
                uVar19 = (ulong)uVar18;
                bVar27 = uVar24 <= uVar18;
                if (bVar27) {
                  uVar18 = 0;
                }
                uVar23 = *(uint *)&piVar2->field_0x5c;
                if (bVar27) {
                  uVar19 = -(ulong)*(uint *)&piVar2->window;
                }
                uVar26 = uVar24 - uVar18;
                if (uVar23 <= uVar24 - uVar18) {
                  uVar26 = uVar23;
                }
                *(uint *)&piVar2->field_0x5c = uVar23 - uVar26;
                uVar18 = uVar26;
                do {
                  *local_78 = local_78[uVar19];
                  local_78 = local_78 + 1;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
                uVar24 = uVar24 - uVar26;
              } while (*(int *)&piVar2->field_0x5c != 0);
              goto LAB_00109bb7;
            }
            pcVar14 = "invalid distance too far back";
          }
          else {
            pcVar14 = "invalid literal/length code";
          }
        }
        else {
          pcVar14 = "invalid distances set";
        }
      }
      else {
        pcVar14 = "invalid literal/lengths set";
      }
    }
LAB_0010a67d:
    local_98->msg = pcVar14;
    piVar2->status = 0x3f51;
    uVar24 = local_90;
  }
  goto LAB_00109bb7;
}

Assistant:

int ZEXPORT inflateBack(strm, in, in_desc, out, out_desc)
z_streamp strm;
in_func in;
void FAR *in_desc;
out_func out;
void FAR *out_desc;
{
    struct inflate_state FAR *state;
    z_const unsigned char FAR *next;    /* next input */
    unsigned char FAR *put;     /* next output */
    unsigned have, left;        /* available input and output */
    unsigned long hold;         /* bit buffer */
    unsigned bits;              /* bits in bit buffer */
    unsigned copy;              /* number of stored or match bytes to copy */
    unsigned char FAR *from;    /* where to copy match bytes from */
    code here;                  /* current decoding table entry */
    code last;                  /* parent table entry */
    unsigned len;               /* length to copy for repeats, bits to drop */
    int ret;                    /* return code */
    static const unsigned short order[19] = /* permutation of code lengths */
        {16, 17, 18, 0, 8, 7, 9, 6, 10, 5, 11, 4, 12, 3, 13, 2, 14, 1, 15};

    /* Check that the strm exists and that the state was initialized */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* Reset the state */
    strm->msg = Z_NULL;
    state->mode = TYPE;
    state->last = 0;
    state->whave = 0;
    next = strm->next_in;
    have = next != Z_NULL ? strm->avail_in : 0;
    hold = 0;
    bits = 0;
    put = state->window;
    left = state->wsize;

    /* Inflate until end of block marked as last */
    for (;;)
        switch (state->mode) {
        case TYPE:
            /* determine and dispatch block type */
            if (state->last) {
                BYTEBITS();
                state->mode = DONE;
                break;
            }
            NEEDBITS(3);
            state->last = BITS(1);
            DROPBITS(1);
            switch (BITS(2)) {
            case 0:                             /* stored block */
                Tracev((stderr, "inflate:     stored block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = STORED;
                break;
            case 1:                             /* fixed block */
                fixedtables(state);
                Tracev((stderr, "inflate:     fixed codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = LEN;              /* decode codes */
                break;
            case 2:                             /* dynamic block */
                Tracev((stderr, "inflate:     dynamic codes block%s\n",
                        state->last ? " (last)" : ""));
                state->mode = TABLE;
                break;
            case 3:
                strm->msg = (char *)"invalid block type";
                state->mode = BAD;
            }
            DROPBITS(2);
            break;

        case STORED:
            /* get and verify stored block length */
            BYTEBITS();                         /* go to byte boundary */
            NEEDBITS(32);
            if ((hold & 0xffff) != ((hold >> 16) ^ 0xffff)) {
                strm->msg = (char *)"invalid stored block lengths";
                state->mode = BAD;
                break;
            }
            state->length = (unsigned)hold & 0xffff;
            Tracev((stderr, "inflate:       stored length %u\n",
                    state->length));
            INITBITS();

            /* copy stored block from input to output */
            while (state->length != 0) {
                copy = state->length;
                PULL();
                ROOM();
                if (copy > have) copy = have;
                if (copy > left) copy = left;
                zmemcpy(put, next, copy);
                have -= copy;
                next += copy;
                left -= copy;
                put += copy;
                state->length -= copy;
            }
            Tracev((stderr, "inflate:       stored end\n"));
            state->mode = TYPE;
            break;

        case TABLE:
            /* get dynamic table entries descriptor */
            NEEDBITS(14);
            state->nlen = BITS(5) + 257;
            DROPBITS(5);
            state->ndist = BITS(5) + 1;
            DROPBITS(5);
            state->ncode = BITS(4) + 4;
            DROPBITS(4);
#ifndef PKZIP_BUG_WORKAROUND
            if (state->nlen > 286 || state->ndist > 30) {
                strm->msg = (char *)"too many length or distance symbols";
                state->mode = BAD;
                break;
            }
#endif
            Tracev((stderr, "inflate:       table sizes ok\n"));

            /* get code length code lengths (not a typo) */
            state->have = 0;
            while (state->have < state->ncode) {
                NEEDBITS(3);
                state->lens[order[state->have++]] = (unsigned short)BITS(3);
                DROPBITS(3);
            }
            while (state->have < 19)
                state->lens[order[state->have++]] = 0;
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 7;
            ret = inflate_table(CODES, state->lens, 19, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid code lengths set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       code lengths ok\n"));

            /* get length and distance code code lengths */
            state->have = 0;
            while (state->have < state->nlen + state->ndist) {
                for (;;) {
                    here = state->lencode[BITS(state->lenbits)];
                    if ((unsigned)(here.bits) <= bits) break;
                    PULLBYTE();
                }
                if (here.val < 16) {
                    DROPBITS(here.bits);
                    state->lens[state->have++] = here.val;
                }
                else {
                    if (here.val == 16) {
                        NEEDBITS(here.bits + 2);
                        DROPBITS(here.bits);
                        if (state->have == 0) {
                            strm->msg = (char *)"invalid bit length repeat";
                            state->mode = BAD;
                            break;
                        }
                        len = (unsigned)(state->lens[state->have - 1]);
                        copy = 3 + BITS(2);
                        DROPBITS(2);
                    }
                    else if (here.val == 17) {
                        NEEDBITS(here.bits + 3);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 3 + BITS(3);
                        DROPBITS(3);
                    }
                    else {
                        NEEDBITS(here.bits + 7);
                        DROPBITS(here.bits);
                        len = 0;
                        copy = 11 + BITS(7);
                        DROPBITS(7);
                    }
                    if (state->have + copy > state->nlen + state->ndist) {
                        strm->msg = (char *)"invalid bit length repeat";
                        state->mode = BAD;
                        break;
                    }
                    while (copy--)
                        state->lens[state->have++] = (unsigned short)len;
                }
            }

            /* handle error breaks in while */
            if (state->mode == BAD) break;

            /* check for end-of-block code (better have one) */
            if (state->lens[256] == 0) {
                strm->msg = (char *)"invalid code -- missing end-of-block";
                state->mode = BAD;
                break;
            }

            /* build code tables -- note: do not change the lenbits or distbits
               values here (9 and 6) without reading the comments in inftrees.h
               concerning the ENOUGH constants, which depend on those values */
            state->next = state->codes;
            state->lencode = (code const FAR *)(state->next);
            state->lenbits = 9;
            ret = inflate_table(LENS, state->lens, state->nlen, &(state->next),
                                &(state->lenbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid literal/lengths set";
                state->mode = BAD;
                break;
            }
            state->distcode = (code const FAR *)(state->next);
            state->distbits = 6;
            ret = inflate_table(DISTS, state->lens + state->nlen, state->ndist,
                            &(state->next), &(state->distbits), state->work);
            if (ret) {
                strm->msg = (char *)"invalid distances set";
                state->mode = BAD;
                break;
            }
            Tracev((stderr, "inflate:       codes ok\n"));
            state->mode = LEN;

        case LEN:
            /* use inflate_fast() if we have enough input and output */
            if (have >= 6 && left >= 258) {
                RESTORE();
                if (state->whave < state->wsize)
                    state->whave = state->wsize - left;
                inflate_fast(strm, state->wsize);
                LOAD();
                break;
            }

            /* get a literal, length, or end-of-block code */
            for (;;) {
                here = state->lencode[BITS(state->lenbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if (here.op && (here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->lencode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            state->length = (unsigned)here.val;

            /* process literal */
            if (here.op == 0) {
                Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                        "inflate:         literal '%c'\n" :
                        "inflate:         literal 0x%02x\n", here.val));
                ROOM();
                *put++ = (unsigned char)(state->length);
                left--;
                state->mode = LEN;
                break;
            }

            /* process end of block */
            if (here.op & 32) {
                Tracevv((stderr, "inflate:         end of block\n"));
                state->mode = TYPE;
                break;
            }

            /* invalid code */
            if (here.op & 64) {
                strm->msg = (char *)"invalid literal/length code";
                state->mode = BAD;
                break;
            }

            /* length code -- get extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->length += BITS(state->extra);
                DROPBITS(state->extra);
            }
            Tracevv((stderr, "inflate:         length %u\n", state->length));

            /* get distance code */
            for (;;) {
                here = state->distcode[BITS(state->distbits)];
                if ((unsigned)(here.bits) <= bits) break;
                PULLBYTE();
            }
            if ((here.op & 0xf0) == 0) {
                last = here;
                for (;;) {
                    here = state->distcode[last.val +
                            (BITS(last.bits + last.op) >> last.bits)];
                    if ((unsigned)(last.bits + here.bits) <= bits) break;
                    PULLBYTE();
                }
                DROPBITS(last.bits);
            }
            DROPBITS(here.bits);
            if (here.op & 64) {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
            state->offset = (unsigned)here.val;

            /* get distance extra bits, if any */
            state->extra = (unsigned)(here.op) & 15;
            if (state->extra != 0) {
                NEEDBITS(state->extra);
                state->offset += BITS(state->extra);
                DROPBITS(state->extra);
            }
            if (state->offset > state->wsize - (state->whave < state->wsize ?
                                                left : 0)) {
                strm->msg = (char *)"invalid distance too far back";
                state->mode = BAD;
                break;
            }
            Tracevv((stderr, "inflate:         distance %u\n", state->offset));

            /* copy match from window to output */
            do {
                ROOM();
                copy = state->wsize - state->offset;
                if (copy < left) {
                    from = put + copy;
                    copy = left - copy;
                }
                else {
                    from = put - state->offset;
                    copy = left;
                }
                if (copy > state->length) copy = state->length;
                state->length -= copy;
                left -= copy;
                do {
                    *put++ = *from++;
                } while (--copy);
            } while (state->length != 0);
            break;

        case DONE:
            /* inflate stream terminated properly -- write leftover output */
            ret = Z_STREAM_END;
            if (left < state->wsize) {
                if (out(out_desc, state->window, state->wsize - left))
                    ret = Z_BUF_ERROR;
            }
            goto inf_leave;

        case BAD:
            ret = Z_DATA_ERROR;
            goto inf_leave;

        default:                /* can't happen, but makes compilers happy */
            ret = Z_STREAM_ERROR;
            goto inf_leave;
        }

    /* Return unused input */
  inf_leave:
    strm->next_in = next;
    strm->avail_in = have;
    return ret;
}